

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int indexCellCompare(BtCursor *pCur,int idx,UnpackedRecord *pIdxKey,RecordCompare xRecordCompare)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  MemPage *pMVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  pMVar4 = pCur->pPage;
  uVar7 = (ulong)(CONCAT11(pMVar4->aCellIdx[(ulong)(uint)idx * 2],
                           pMVar4->aCellIdx[(ulong)(uint)idx * 2 + 1]) & pMVar4->maskPage);
  pbVar1 = pMVar4->aDataOfst + uVar7;
  bVar2 = *pbVar1;
  if (bVar2 <= pMVar4->max1bytePayload) {
    iVar5 = (*xRecordCompare)((uint)bVar2,pbVar1 + 1,pIdxKey);
    return iVar5;
  }
  bVar3 = pbVar1[1];
  if ((-1 < (char)bVar3) &&
     (uVar6 = (bVar2 & 0x7f) << 7 | (int)(char)bVar3, uVar6 <= pMVar4->maxLocal)) {
    iVar5 = (*xRecordCompare)(uVar6,pMVar4->aDataOfst + uVar7 + 2,pIdxKey);
    return iVar5;
  }
  return 99;
}

Assistant:

static int indexCellCompare(
  BtCursor *pCur,
  int idx,
  UnpackedRecord *pIdxKey,
  RecordCompare xRecordCompare
){
  MemPage *pPage = pCur->pPage;
  int c;
  int nCell;  /* Size of the pCell cell in bytes */
  u8 *pCell = findCellPastPtr(pPage, idx);

  nCell = pCell[0];
  if( nCell<=pPage->max1bytePayload ){
    /* This branch runs if the record-size field of the cell is a
    ** single byte varint and the record fits entirely on the main
    ** b-tree page.  */
    testcase( pCell+nCell+1==pPage->aDataEnd );
    c = xRecordCompare(nCell, (void*)&pCell[1], pIdxKey);
  }else if( !(pCell[1] & 0x80)
    && (nCell = ((nCell&0x7f)<<7) + pCell[1])<=pPage->maxLocal
  ){
    /* The record-size field is a 2 byte varint and the record
    ** fits entirely on the main b-tree page.  */
    testcase( pCell+nCell+2==pPage->aDataEnd );
    c = xRecordCompare(nCell, (void*)&pCell[2], pIdxKey);
  }else{
    /* If the record extends into overflow pages, do not attempt
    ** the optimization. */
    c = 99;
  }
  return c;
}